

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O3

DWORD * __thiscall ExportEntryWrapper::getFuncRvaPtr(ExportEntryWrapper *this)

{
  ExportDirWrapper *this_00;
  Executable *pEVar1;
  int iVar2;
  offset_t oVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  this_00 = this->parentDir;
  if (this_00 != (ExportDirWrapper *)0x0) {
    oVar3 = DataDirEntryWrapper::getDirEntryAddress(&this_00->super_DataDirEntryWrapper);
    pEVar1 = (this_00->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                      (pEVar1,oVar3,2,0x28,0);
    if (CONCAT44(extraout_var,iVar2) != 0) {
      pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
      iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                        (pEVar1,(ulong)*(uint *)(CONCAT44(extraout_var,iVar2) + 0x1c) +
                                (this->super_ExeNodeWrapper).entryNum * 4,2,4,0);
      return (DWORD *)CONCAT44(extraout_var_00,iVar2);
    }
  }
  return (DWORD *)0x0;
}

Assistant:

DWORD* ExportEntryWrapper::getFuncRvaPtr()
{
    if (this->parentDir == NULL) return NULL;
    IMAGE_EXPORT_DIRECTORY* exp = parentDir->exportDir();
    if (exp == NULL) return NULL;

    uint64_t funcRva = exp->AddressOfFunctions;
    funcRva += (this->entryNum * sizeof(DWORD));

    DWORD *ptr =  (DWORD*) m_Exe->getContentAt(funcRva, Executable::RVA, sizeof(DWORD));
    return ptr;
}